

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

void __thiscall OB::Parg::set(Parg *this,string *_name,string *_default,string *_arg,string *_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *pmVar1;
  pointer pcVar2;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  string _short;
  string delim;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  stringstream out;
  key_type local_318;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string *local_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,",","");
  lVar3 = std::__cxx11::string::find((char *)_name,(ulong)local_2b8,0);
  if (lVar3 == -1) {
    pmVar1 = &this->data_;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,_name);
    std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,_name);
    pmVar5->mode_ = false;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,_name);
    std::__cxx11::string::_M_assign((string *)&pmVar5->value_);
    std::operator+(&local_2d8,"  --",_name);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_2e8 = *plVar8;
      lStack_2e0 = plVar6[3];
      local_2f8 = &local_2e8;
    }
    else {
      local_2e8 = *plVar8;
      local_2f8 = (long *)*plVar6;
    }
    local_2f0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)(_arg->_M_dataplus)._M_p);
    puVar10 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_318.field_2._M_allocated_capacity = *puVar10;
      local_318.field_2._8_8_ = plVar6[3];
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    }
    else {
      local_318.field_2._M_allocated_capacity = *puVar10;
      local_318._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_318._M_string_length = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1a8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1a8[0]._8_8_ = plVar6[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1b8 + 0x10);
    }
    else {
      local_1a8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_1b8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->options_,local_1b8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    uVar11 = local_2d8.field_2._M_allocated_capacity;
    _Var12._M_p = local_2d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p == &local_2d8.field_2) goto LAB_0010790e;
  }
  else {
    local_1b8._0_8_ = local_1b8 + 0x10;
    local_1b8._8_8_ = 0;
    local_1a8[0]._M_allocated_capacity = local_1a8[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    local_318._M_string_length = 0;
    local_318.field_2._M_allocated_capacity =
         local_318.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar2 = (_name->_M_dataplus)._M_p;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + _name->_M_string_length);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_2b8,local_2b0 + (long)local_2b8);
    delimit(&local_298,this,&local_1f8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((local_298.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         local_298.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (0x40 < (ulong)((long)local_298.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_298.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start))) {
      __assert_fail("names.size() >= 1 && names.size() <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/parg.hh"
                    ,0xd9,"void OB::Parg::set(std::string, std::string, std::string, std::string)");
    }
    std::__cxx11::string::_M_assign((string *)local_1b8);
    if ((long)local_298.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_298.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if (local_298.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 1) {
        __assert_fail("names.at(1).size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/parg.hh"
                      ,0xe0,"void OB::Parg::set(std::string, std::string, std::string, std::string)"
                     );
      }
      std::__cxx11::string::_M_assign((string *)&local_318);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->flags_,&local_318);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    pmVar1 = &this->data_;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    std::__cxx11::string::_M_assign((string *)&pmVar5->long_);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    pmVar5->mode_ = false;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::operator[](pmVar1,(key_type *)local_1b8);
    std::__cxx11::string::_M_assign((string *)&pmVar5->value_);
    std::operator+(&local_1d8,"  -",&local_318);
    local_280 = _info;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_268 = *plVar8;
      lStack_260 = plVar6[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *plVar8;
      local_278 = (long *)*plVar6;
    }
    local_270 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_278,local_1b8._0_8_);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_248 = *plVar8;
      lStack_240 = plVar6[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *plVar8;
      local_258 = (long *)*plVar6;
    }
    local_250 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_228 = *plVar8;
      lStack_220 = plVar6[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *plVar8;
      local_238 = (long *)*plVar6;
    }
    local_230 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_238,(ulong)(_arg->_M_dataplus)._M_p);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_2d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2d8.field_2._8_8_ = plVar6[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_2d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2d8._M_string_length = plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_2e8 = *plVar8;
      lStack_2e0 = plVar6[3];
      local_2f8 = &local_2e8;
    }
    else {
      local_2e8 = *plVar8;
      local_2f8 = (long *)*plVar6;
    }
    local_2f0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&this->options_,(ulong)local_2f8);
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    _info = local_280;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    uVar11 = local_1a8[0]._M_allocated_capacity;
    _Var12._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) goto LAB_0010790e;
  }
  operator_delete(_Var12._M_p,uVar11 + 1);
LAB_0010790e:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b8 + 0x10),(_info->_M_dataplus)._M_p,
                      _info->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->options_,(ulong)local_318._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  return;
}

Assistant:

void set(std::string _name, std::string _default, std::string _arg, std::string _info)
  {
    // sets an option
    std::string delim {","};
    if (_name.find(delim) != std::string::npos)
    {
      bool has_short {false};
      std::string _long;
      std::string _short;

      auto const names = delimit(_name, delim);
      assert(names.size() >= 1 && names.size() <= 2);
      _long = names.at(0);

      if (names.size() == 2) has_short = true;
      if (has_short)
      {
        // short name must be one char
        assert(names.at(1).size() == 1);
        _short = names.at(1);
      }

      flags_[_short] = _long;
      data_[_long].long_ = _long;
      data_[_long].short_ = _short;
      data_[_long].mode_ = false;
      data_[_long].value_ = _default;
      options_.append("  -" + _short + ", --" + _long + "=<" + _arg + ">\n");
    }
    else
    {
      data_[_name].long_ = _name;
      data_[_name].mode_ = false;
      data_[_name].value_ = _default;
      options_.append("  --" + _name + "=<" + _arg + ">\n");
    }

    std::stringstream out;
    out << "    " << _info << "\n";
    options_.append(out.str());
  }